

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O1

IDeckLinkDeviceNotificationCallback *
cdecklink_internal_callback_create_deck_link_device_notification_callback
          (void *ctx,undefined1 *cb0,undefined1 *cb1)

{
  IDeckLinkDeviceNotificationCallback *pIVar1;
  
  if (cb0 != (undefined1 *)0x0 || cb1 != (undefined1 *)0x0) {
    pIVar1 = (IDeckLinkDeviceNotificationCallback *)operator_new(0x28);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108d58;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar1[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    return pIVar1;
  }
  return (IDeckLinkDeviceNotificationCallback *)0x0;
}

Assistant:

IDeckLinkDeviceNotificationCallback* cdecklink_internal_callback_create_deck_link_device_notification_callback (void *ctx, cdecklink_device_notification_callback_deck_link_device_arrived *cb0, cdecklink_device_notification_callback_deck_link_device_removed *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkDeviceNotificationCallback(ctx, cb0, cb1);
	}
	return nullptr;
}